

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

Llb_Mnx_t * Llb_MnxStart(Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  int iVar1;
  Llb_Mnx_t *pLVar2;
  DdManager *pDVar3;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  long lVar7;
  abctime aVar8;
  int iVar9;
  uint numVars;
  timespec ts;
  timespec local_30;
  
  pLVar2 = (Llb_Mnx_t *)calloc(1,0x80);
  pLVar2->pAig = pAig;
  pLVar2->pPars = pPars;
  iVar9 = pPars->TimeLimit;
  if ((long)iVar9 == 0) {
    aVar8 = 0;
  }
  else {
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    aVar8 = lVar7 + (long)iVar9 * 1000000;
  }
  pLVar2->pPars->TimeTarget = aVar8;
  if (pPars->fCluster == 0) {
    pVVar4 = Llb_Nonlin4CreateOrder(pAig);
    pLVar2->vOrder = pVVar4;
    if ((long)pVVar4->nSize < 1) {
      numVars = 1;
    }
    else {
      lVar7 = 0;
      iVar9 = 0;
      do {
        iVar9 = iVar9 + (uint)(0 < pVVar4->pArray[lVar7]);
        lVar7 = lVar7 + 1;
      } while (pVVar4->nSize != lVar7);
      numVars = iVar9 + 1;
    }
    pDVar3 = Cudd_Init(numVars,0,0x100,0x40000,0);
    pLVar2->dd = pDVar3;
    Cudd_AutodynEnable(pDVar3,CUDD_REORDER_SYMM_SIFT);
    Cudd_SetMaxGrowth(pLVar2->dd,1.05);
    pDVar3 = pLVar2->dd;
    pDVar3->TimeStop = pLVar2->pPars->TimeTarget;
    pVVar5 = Llb_Nonlin4DerivePartitions(pDVar3,pAig,pLVar2->vOrder);
    pLVar2->vRoots = pVVar5;
  }
  else {
    Llb4_Nonlin4Sweep(pLVar2->pAig,pPars->nBddMax,pPars->nClusterMax,&pLVar2->dd,&pLVar2->vOrder,
                      &pLVar2->vRoots,pPars->fVerbose);
    pLVar2->dd->TimeStop = pLVar2->pPars->TimeTarget;
  }
  Llb_Nonlin4SetupVarMap(pLVar2->dd,pAig,pLVar2->vOrder);
  pVVar4 = Llb_Nonlin4CreateVars2Q(pLVar2->dd,pAig,pLVar2->vOrder,pLVar2->pPars->fBackward);
  pLVar2->vVars2Q = pVVar4;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  pLVar2->vRings = pVVar5;
  if (pPars->fReorder != 0) {
    Llb_Nonlin4Reorder(pLVar2->dd,0,1);
  }
  return pLVar2;
}

Assistant:

Llb_Mnx_t * Llb_MnxStart( Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    Llb_Mnx_t * p;

    p = ABC_CALLOC( Llb_Mnx_t, 1 );
    p->pAig    = pAig;
    p->pPars   = pPars;

    // compute time to stop
    p->pPars->TimeTarget = p->pPars->TimeLimit ? p->pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    if ( pPars->fCluster )
    {
//        Llb_Nonlin4Cluster( p->pAig, &p->dd, &p->vOrder, &p->vRoots, pPars->nBddMax, pPars->fVerbose );
//        Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
        Llb4_Nonlin4Sweep( p->pAig, pPars->nBddMax, pPars->nClusterMax, &p->dd, &p->vOrder, &p->vRoots, pPars->fVerbose );
		// set the stop time parameter
		p->dd->TimeStop  = p->pPars->TimeTarget;
    }
    else
    {
//    p->vOrder  = Llb_Nonlin4CreateOrderSimple( pAig );
        p->vOrder  = Llb_Nonlin4CreateOrder( pAig );
        p->dd      = Cudd_Init( Vec_IntCountPositive(p->vOrder) + 1, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
        Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
        Cudd_SetMaxGrowth( p->dd, 1.05 );
		// set the stop time parameter
		p->dd->TimeStop  = p->pPars->TimeTarget;
        p->vRoots  = Llb_Nonlin4DerivePartitions( p->dd, pAig, p->vOrder );
    }

    Llb_Nonlin4SetupVarMap( p->dd, pAig, p->vOrder );
    p->vVars2Q = Llb_Nonlin4CreateVars2Q( p->dd, pAig, p->vOrder, p->pPars->fBackward );
    p->vRings  = Vec_PtrAlloc( 100 );

    if ( pPars->fReorder )
        Llb_Nonlin4Reorder( p->dd, 0, 1 );
    return p;
}